

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

int Abs_ManSupport3(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  int iVar11;
  int Entry;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  
  Abs_ManSupport2(p,pObj,vSupp);
  uVar8 = Abs_GiaSortNodes(p,vSupp);
  if ((int)uVar8 < 1) {
    __assert_fail("nSize0 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x218,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  uVar9 = vSupp->nSize;
  if ((int)uVar9 < 1) {
    return uVar9;
  }
LAB_0057e098:
  piVar10 = vSupp->pArray;
  uVar12 = (ulong)uVar9;
  uVar15 = 0;
  do {
    iVar11 = piVar10[uVar15];
    lVar14 = (long)iVar11;
    if (lVar14 < 0) {
LAB_0057e481:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar13 = p->nObjs;
    if ((int)uVar13 <= iVar11) goto LAB_0057e481;
    pGVar5 = p->pObjs;
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      return uVar9;
    }
    if (uVar8 <= uVar15) {
      pGVar1 = pGVar5 + lVar14;
      uVar6 = *(ulong *)pGVar1;
      if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
        if ((uVar6 >> 0x3e & 1) != 0) {
          __assert_fail("!pTemp->fMark1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x223,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        if (p->pRefs[lVar14] < 1) {
          __assert_fail("Gia_ObjRefNum(p, pTemp) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x224,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        pGVar2 = pGVar1 + -(uVar6 & 0x1fffffff);
        if ((pGVar2 < pGVar5) || (pGVar3 = pGVar5 + uVar13, pGVar3 <= pGVar2)) goto LAB_0057e4a0;
        Entry = (int)((long)pGVar2 - (long)pGVar5 >> 2) * -0x55555555;
        iVar4 = p->nTravIdsAlloc;
        if (iVar4 <= Entry) goto LAB_0057e4bf;
        pGVar1 = pGVar1 + -(ulong)((uint)(uVar6 >> 0x20) & 0x1fffffff);
        piVar7 = p->pTravIds;
        if (piVar7[Entry] == p->nTravIds) {
          if (pGVar3 <= pGVar1 || pGVar1 < pGVar5) goto LAB_0057e4a0;
          iVar16 = (int)((long)pGVar1 - (long)pGVar5 >> 2) * -0x55555555;
          if (iVar4 <= iVar16) goto LAB_0057e4bf;
          if (piVar7[iVar16] == piVar7[Entry]) {
            uVar15 = 1;
            goto LAB_0057e254;
          }
          uVar15 = 1;
          break;
        }
        if (pGVar3 <= pGVar1 || pGVar1 < pGVar5) goto LAB_0057e4a0;
        iVar16 = (int)((long)pGVar1 - (long)pGVar5 >> 2) * -0x55555555;
        if (iVar4 <= iVar16) goto LAB_0057e4bf;
        if (piVar7[iVar16] == p->nTravIds) goto LAB_0057e274;
      }
    }
    uVar15 = uVar15 + 1;
    if (uVar12 == uVar15) {
      return uVar9;
    }
  } while( true );
LAB_0057e2ac:
  if (piVar10[uVar15 - 1] != iVar11) goto code_r0x0057e2b7;
  if ((int)uVar15 < (int)uVar9) {
    do {
      piVar10[uVar15 - 1] = piVar10[uVar15];
      uVar15 = uVar15 + 1;
      uVar9 = vSupp->nSize;
    } while ((int)uVar15 < (int)uVar9);
    uVar13 = p->nObjs;
  }
  vSupp->nSize = uVar9 - 1;
LAB_0057e3da:
  if (pGVar5 + (int)uVar13 <= pGVar1) goto LAB_0057e4a0;
  Vec_IntPush(vSupp,iVar16);
  pGVar5 = p->pObjs;
  if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) goto LAB_0057e4a0;
  iVar11 = (int)((long)pGVar1 - (long)pGVar5 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar11) goto LAB_0057e4bf;
  piVar10 = p->pTravIds;
  lVar14 = (long)iVar11;
  iVar11 = p->nTravIds;
  if (piVar10[lVar14] == iVar11) {
    __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x231,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  goto LAB_0057e455;
code_r0x0057e2b7:
  bVar17 = uVar15 == uVar12;
  uVar15 = uVar15 + 1;
  if (bVar17) goto LAB_0057e3da;
  goto LAB_0057e2ac;
LAB_0057e254:
  if (piVar10[uVar15 - 1] != iVar11) goto code_r0x0057e25f;
  if ((int)uVar15 < (int)uVar9) {
    do {
      piVar10[uVar15 - 1] = piVar10[uVar15];
      uVar15 = uVar15 + 1;
      uVar9 = vSupp->nSize;
    } while ((int)uVar15 < (int)uVar9);
  }
  vSupp->nSize = uVar9 - 1;
  goto LAB_0057e45c;
code_r0x0057e25f:
  bVar17 = uVar15 == uVar12;
  uVar15 = uVar15 + 1;
  if (bVar17) goto LAB_0057e45c;
  goto LAB_0057e254;
LAB_0057e274:
  uVar15 = 1;
  while (piVar10[uVar15 - 1] != iVar11) {
    bVar17 = uVar15 == uVar12;
    uVar15 = uVar15 + 1;
    if (bVar17) goto LAB_0057e301;
  }
  if ((int)uVar15 < (int)uVar9) {
    do {
      piVar10[uVar15 - 1] = piVar10[uVar15];
      uVar15 = uVar15 + 1;
      uVar9 = vSupp->nSize;
    } while ((int)uVar15 < (int)uVar9);
    uVar13 = p->nObjs;
  }
  vSupp->nSize = uVar9 - 1;
LAB_0057e301:
  if (pGVar2 < pGVar5 + (int)uVar13) {
    Vec_IntPush(vSupp,Entry);
    pGVar5 = p->pObjs;
    if ((pGVar5 <= pGVar2) && (pGVar2 < pGVar5 + p->nObjs)) {
      iVar11 = (int)((long)pGVar2 - (long)pGVar5 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar11) {
LAB_0057e4bf:
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      piVar10 = p->pTravIds;
      lVar14 = (long)iVar11;
      iVar11 = p->nTravIds;
      if (piVar10[lVar14] == iVar11) {
        __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x23a,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
LAB_0057e455:
      piVar10[lVar14] = iVar11;
LAB_0057e45c:
      uVar9 = vSupp->nSize;
      if ((int)uVar9 < 1) {
        return uVar9;
      }
      goto LAB_0057e098;
    }
  }
LAB_0057e4a0:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Abs_ManSupport3( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pTemp, * pFan0, * pFan1;
    int i, nSize0;
    // collect MFFC
    Abs_ManSupport2( p, pObj, vSupp );
    // move dominated to the front
    nSize0 = Abs_GiaSortNodes( p, vSupp );
    assert( nSize0 > 0 );
    // consider remaining nodes
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObjVec( vSupp, p, pTemp, i )
        {
            if ( i < nSize0 )
                continue;
            if ( !Gia_ObjIsAnd(pTemp) )
                continue;
            assert( !pTemp->fMark1 );
            assert( Gia_ObjRefNum(p, pTemp) > 0 );
            pFan0 = Gia_ObjFanin0(pTemp);
            pFan1 = Gia_ObjFanin1(pTemp);
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) && Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan1) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan1) );
                Gia_ObjSetTravIdCurrent(p, pFan1);
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan0) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan0) );
                Gia_ObjSetTravIdCurrent(p, pFan0);
                fChanges = 1;
                break;
            }
        }
        if ( !fChanges )
            break;
    }
    return Vec_IntSize(vSupp);
}